

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void basist::basisu_transcoder_init(void)

{
  ushort uVar1;
  ulong uVar2;
  uint32_t i;
  long lVar3;
  undefined4 *puVar4;
  undefined1 *puVar5;
  ulong uVar6;
  byte bVar7;
  uint32_t base_color;
  int iVar8;
  long lVar9;
  int hi_1;
  uint32_t k_inv;
  int iVar10;
  uint uVar11;
  int iVar12;
  int lo;
  int *piVar13;
  int lo_1;
  long lVar14;
  uint32_t inten_table;
  int iVar15;
  long lVar16;
  uint32_t l_1;
  int iVar17;
  uint *puVar18;
  int hi;
  int iVar19;
  int iVar20;
  long lVar21;
  uint32_t range_index;
  long lVar22;
  uint uVar23;
  uint32_t mapping_index;
  ulong uVar24;
  uint32_t k;
  uint uVar25;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1_inv [4];
  uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1 [4];
  uint8_t bc1_expand5 [32];
  uint8_t bc1_expand6 [64];
  byte abStack_a0 [4];
  byte abStack_9c [4];
  byte local_98 [104];
  
  if (g_transcoder_initialized == '\0') {
    uastc_init();
    lVar3 = 0x279c82;
    lVar9 = 0;
    do {
      lVar16 = 0;
      lVar14 = lVar3;
      do {
        lVar22 = 0;
        lVar21 = lVar14;
        do {
          uVar11 = 0xffffffff;
          uVar24 = 0;
          uVar6 = 0;
          do {
            uVar1 = *(ushort *)(lVar21 + uVar24 * 4);
            uVar6 = uVar6 & 0xff;
            if (uVar1 < uVar11) {
              uVar6 = uVar24 & 0xffffffff;
            }
            if (uVar1 <= uVar11) {
              uVar11 = (uint)uVar1;
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != 10);
          (&g_etc1_to_astc_best_grayscale_mapping)[lVar22 + lVar16 * 6 + lVar9 * 0x30] = (char)uVar6
          ;
          lVar22 = lVar22 + 1;
          lVar21 = lVar21 + 0x28;
        } while (lVar22 != 6);
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x1e00;
      } while (lVar16 != 8);
      lVar9 = lVar9 + 1;
      lVar3 = lVar3 + 0xf0;
    } while (lVar9 != 0x20);
    lVar3 = 0x288c82;
    lVar9 = 0;
    do {
      lVar16 = 0;
      lVar14 = lVar3;
      do {
        lVar22 = 0;
        lVar21 = lVar14;
        do {
          uVar11 = 0xffffffff;
          uVar24 = 0;
          uVar6 = 0;
          do {
            uVar1 = *(ushort *)(lVar21 + uVar24 * 4);
            uVar6 = uVar6 & 0xff;
            if (uVar1 < uVar11) {
              uVar6 = uVar24 & 0xffffffff;
            }
            if (uVar1 <= uVar11) {
              uVar11 = (uint)uVar1;
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != 10);
          (&g_etc1_to_astc_best_grayscale_mapping_0_255)[lVar22 + lVar16 * 6 + lVar9 * 0x30] =
               (char)uVar6;
          lVar22 = lVar22 + 1;
          lVar21 = lVar21 + 0x28;
        } while (lVar22 != 6);
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x1e00;
      } while (lVar16 != 8);
      lVar9 = lVar9 + 1;
      lVar3 = lVar3 + 0xf0;
    } while (lVar9 != 0x20);
    lVar3 = 0;
    do {
      *(int *)(g_etc1_to_astc_selector_range_index +
              (ulong)(uint)(&DAT_00297c84)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    puVar4 = &g_ise_to_unquant;
    lVar3 = 0;
    auVar26 = pmovsxbd(extraout_XMM0,0x3020100);
    auVar27 = pmovzxbd(in_XMM1,0x80808080);
    auVar28 = pmovsxbd(in_XMM2,0x4040404);
    do {
      iVar8 = (int)lVar3 * 0x16;
      lVar9 = 0;
      auVar29 = auVar26;
      do {
        uVar11 = auVar29._0_4_;
        uVar25 = auVar29._4_4_;
        uVar23 = auVar29._8_4_;
        uVar31 = auVar29._12_4_;
        auVar30._0_4_ = (int)(uVar11 << 0x1f) >> 0x1f;
        auVar30._4_4_ = (int)(uVar25 << 0x1f) >> 0x1f;
        auVar30._8_4_ = (int)(uVar23 << 0x1f) >> 0x1f;
        auVar30._12_4_ = (int)(uVar31 << 0x1f) >> 0x1f;
        auVar32._0_4_ = ((uVar11 >> 1) * 0x41 + iVar8 ^ auVar30._0_4_ >> 0x17) >> 2;
        auVar32._4_4_ = ((uVar25 >> 1) * 0x41 + iVar8 ^ auVar30._4_4_ >> 0x17) >> 2;
        auVar32._8_4_ = ((uVar23 >> 1) * 0x41 + iVar8 ^ auVar30._8_4_ >> 0x17) >> 2;
        auVar32._12_4_ = ((uVar31 >> 1) * 0x41 + iVar8 ^ auVar30._12_4_ >> 0x17) >> 2;
        *(undefined1 (*) [16])(puVar4 + lVar9) = auVar32 | auVar30 & auVar27;
        lVar9 = lVar9 + 4;
        auVar29._0_4_ = uVar11 + auVar28._0_4_;
        auVar29._4_4_ = uVar25 + auVar28._4_4_;
        auVar29._8_4_ = uVar23 + auVar28._8_4_;
        auVar29._12_4_ = uVar31 + auVar28._12_4_;
      } while (lVar9 != 0x10);
      lVar3 = lVar3 + 1;
      puVar4 = puVar4 + 0x10;
    } while (lVar3 != 3);
    lVar3 = 0;
    do {
      iVar8 = 0x7fffffff;
      lVar9 = 0;
      do {
        iVar15 = ((&g_ise_to_unquant)[lVar9] << 8 | (&g_ise_to_unquant)[lVar9]) * 0x2b;
        puVar18 = &g_ise_to_unquant;
        lVar14 = 0;
        do {
          iVar19 = (*puVar18 << 8 | *puVar18) * 0x15;
          iVar10 = iVar15 + 0x20 + iVar19;
          iVar19 = iVar15 + 0x5f + iVar19;
          if (-1 < iVar10) {
            iVar19 = iVar10;
          }
          iVar10 = (iVar19 >> 0xe) - (int)lVar3;
          iVar19 = -iVar10;
          if (0 < iVar10) {
            iVar19 = iVar10;
          }
          if (iVar19 < iVar8) {
            (&DAT_0035d881)[lVar3 * 2] = (char)lVar14;
            (&g_astc_single_color_encoding_1)[lVar3 * 2] = (char)lVar9;
            iVar8 = iVar19;
          }
          lVar14 = lVar14 + 1;
          puVar18 = puVar18 + 1;
        } while (lVar14 != 0x30);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x30);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    lVar3 = 0;
    do {
      iVar8 = 0x7fffffff;
      piVar13 = &g_ise_to_unquant;
      lVar9 = 0;
      do {
        iVar19 = *piVar13 - (int)lVar3;
        iVar15 = -iVar19;
        if (0 < iVar19) {
          iVar15 = iVar19;
        }
        if (iVar15 < iVar8) {
          (&g_astc_single_color_encoding_0)[lVar3] = (char)lVar9;
          iVar8 = iVar15;
        }
        lVar9 = lVar9 + 1;
        piVar13 = piVar13 + 1;
      } while (lVar9 != 0x30);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    local_98[0] = 0;
    local_98[1] = 8;
    local_98[2] = 0x10;
    local_98[3] = 0x18;
    local_98[4] = 0x21;
    local_98[5] = 0x29;
    local_98[6] = 0x31;
    local_98[7] = 0x39;
    local_98[8] = 0x42;
    local_98[9] = 0x4a;
    local_98[10] = 0x52;
    local_98[0xb] = 0x5a;
    local_98[0xc] = 99;
    local_98[0xd] = 0x6b;
    local_98[0xe] = 0x73;
    local_98[0xf] = 0x7b;
    local_98[0x10] = 0x84;
    local_98[0x11] = 0x8c;
    local_98[0x12] = 0x94;
    local_98[0x13] = 0x9c;
    local_98[0x14] = 0xa5;
    local_98[0x15] = 0xad;
    local_98[0x16] = 0xb5;
    local_98[0x17] = 0xbd;
    local_98[0x18] = 0xc6;
    local_98[0x19] = 0xce;
    local_98[0x1a] = 0xd6;
    local_98[0x1b] = 0xde;
    local_98[0x1c] = 0xe7;
    local_98[0x1d] = 0xef;
    local_98[0x1e] = 0xf7;
    local_98[0x1f] = 0xff;
    prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match5_equals_1,local_98,0x20,0x20,1);
    lVar3 = 0;
    do {
      iVar8 = 0x100;
      lVar9 = 0;
      do {
        iVar19 = (uint)local_98[lVar9] - (int)lVar3;
        iVar15 = -iVar19;
        if (0 < iVar19) {
          iVar15 = iVar19;
        }
        if (iVar15 < iVar8) {
          (&g_bc1_match5_equals_0)[lVar3 * 2] = (char)lVar9;
          (&DAT_00357ac1)[lVar3 * 2] = 0;
          iVar8 = iVar15;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x20);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    local_98[0x20] = 0;
    local_98[0x21] = 4;
    local_98[0x22] = 8;
    local_98[0x23] = 0xc;
    local_98[0x24] = 0x10;
    local_98[0x25] = 0x14;
    local_98[0x26] = 0x18;
    local_98[0x27] = 0x1c;
    local_98[0x28] = 0x20;
    local_98[0x29] = 0x24;
    local_98[0x2a] = 0x28;
    local_98[0x2b] = 0x2c;
    local_98[0x2c] = 0x30;
    local_98[0x2d] = 0x34;
    local_98[0x2e] = 0x38;
    local_98[0x2f] = 0x3c;
    local_98[0x30] = 0x41;
    local_98[0x31] = 0x45;
    local_98[0x32] = 0x49;
    local_98[0x33] = 0x4d;
    local_98[0x34] = 0x51;
    local_98[0x35] = 0x55;
    local_98[0x36] = 0x59;
    local_98[0x37] = 0x5d;
    local_98[0x38] = 0x61;
    local_98[0x39] = 0x65;
    local_98[0x3a] = 0x69;
    local_98[0x3b] = 0x6d;
    local_98[0x3c] = 0x71;
    local_98[0x3d] = 0x75;
    local_98[0x3e] = 0x79;
    local_98[0x3f] = 0x7d;
    local_98[0x40] = 0x82;
    local_98[0x41] = 0x86;
    local_98[0x42] = 0x8a;
    local_98[0x43] = 0x8e;
    local_98[0x44] = 0x92;
    local_98[0x45] = 0x96;
    local_98[0x46] = 0x9a;
    local_98[0x47] = 0x9e;
    local_98[0x48] = 0xa2;
    local_98[0x49] = 0xa6;
    local_98[0x4a] = 0xaa;
    local_98[0x4b] = 0xae;
    local_98[0x4c] = 0xb2;
    local_98[0x4d] = 0xb6;
    local_98[0x4e] = 0xba;
    local_98[0x4f] = 0xbe;
    local_98[0x50] = 0xc3;
    local_98[0x51] = 199;
    local_98[0x52] = 0xcb;
    local_98[0x53] = 0xcf;
    local_98[0x54] = 0xd3;
    local_98[0x55] = 0xd7;
    local_98[0x56] = 0xdb;
    local_98[0x57] = 0xdf;
    local_98[0x58] = 0xe3;
    local_98[0x59] = 0xe7;
    local_98[0x5a] = 0xeb;
    local_98[0x5b] = 0xef;
    local_98[0x5c] = 0xf3;
    local_98[0x5d] = 0xf7;
    local_98[0x5e] = 0xfb;
    local_98[0x5f] = 0xff;
    prepare_bc1_single_color_table
              ((bc1_match_entry *)g_bc1_match6_equals_1,local_98 + 0x20,0x40,0x40,1);
    lVar3 = 0;
    do {
      iVar8 = 0x100;
      lVar9 = 0;
      do {
        iVar19 = (uint)local_98[lVar9 + 0x20] - (int)lVar3;
        iVar15 = -iVar19;
        if (0 < iVar19) {
          iVar15 = iVar19;
        }
        if (iVar15 < iVar8) {
          (&g_bc1_match6_equals_0)[lVar3 * 2] = (char)lVar9;
          (&DAT_00357ec1)[lVar3 * 2] = 0;
          iVar8 = iVar15;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x40);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    lVar3 = 0;
    do {
      *(int *)(g_etc1_to_dxt1_selector_range_index +
              (ulong)(uint)(&DAT_00297c84)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    puVar5 = &g_etc1s_to_atc_selector_mappings;
    lVar3 = 0;
    do {
      lVar9 = 0;
      do {
        bVar7 = ""[(byte)puVar5[lVar9]];
        abStack_9c[lVar9] = bVar7;
        abStack_a0[lVar9] = "\x01"[bVar7];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      lVar9 = 0;
      do {
        iVar8 = 0;
        uVar11 = 0;
        uVar25 = 0;
        do {
          bVar7 = (byte)iVar8;
          uVar23 = (uint)lVar9 >> (bVar7 & 0x1f) & 3;
          uVar25 = uVar25 | (uint)abStack_9c[uVar23] << (bVar7 & 0x1f);
          uVar11 = uVar11 | (uint)abStack_a0[uVar23] << (bVar7 & 0x1f);
          iVar8 = iVar8 + 2;
        } while (iVar8 != 8);
        (&g_etc1_to_dxt1_selector_mappings_raw_dxt1_256)[lVar9 + lVar3 * 0x100] = (char)uVar25;
        (&g_etc1_to_dxt1_selector_mappings_raw_dxt1_inv_256)[lVar9 + lVar3 * 0x100] = (char)uVar11;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x100);
      lVar3 = lVar3 + 1;
      puVar5 = puVar5 + 4;
    } while (lVar3 != 10);
    lVar3 = 0;
    do {
      *(int *)(g_etc1_to_bc7_m5_selector_range_index +
              (ulong)(uint)(&DAT_00297c84)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    lVar3 = 0;
    do {
      *(int *)(g_etc1_to_bc7_m5a_selector_range_index +
              (ulong)(uint)(&DAT_00297c84)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    prepare_atc_single_color_table((atc_match_entry *)g_pvrtc2_match45_equals_1,0x10,0x20,1);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match55_equals_1,0x20,0x20,1);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match56_equals_1,0x20,0x40,1);
    prepare_atc_single_color_table((atc_match_entry *)g_pvrtc2_match4,1,0x10,3);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match5,1,0x20,3);
    prepare_atc_single_color_table((atc_match_entry *)g_atc_match6,1,0x40,3);
    lVar3 = 0;
    do {
      *(int *)(g_etc1s_to_atc_selector_range_index +
              (ulong)(uint)(&DAT_00297c84)[lVar3 * 2] * 4 +
              (ulong)(uint)(&g_etc1s_to_atc_selector_ranges)[lVar3 * 2] * 0x10) = (int)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    lVar3 = 0;
    do {
      iVar8 = 0x7fffffff;
      uVar11 = 0x33;
      iVar19 = 0;
      iVar15 = 0;
      iVar10 = 0;
      do {
        iVar20 = 0;
        uVar25 = uVar11;
        do {
          iVar12 = (int)lVar3 - (uVar25 >> 3);
          iVar17 = -iVar12;
          if (0 < iVar12) {
            iVar17 = iVar12;
          }
          if (iVar17 < iVar8) {
            iVar19 = iVar10;
            iVar8 = iVar17;
            iVar15 = iVar20;
          }
          iVar20 = iVar20 + 1;
          uVar25 = uVar25 + 0x66;
        } while (iVar20 != 8);
        iVar10 = iVar10 + 1;
        uVar11 = uVar11 + 0xaa;
      } while (iVar10 != 8);
      (&g_pvrtc2_alpha_match33)[lVar3 * 2] = (char)iVar19;
      (&DAT_0035e7c1)[lVar3 * 2] = (char)iVar15;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    uVar6 = 0;
    do {
      iVar15 = 0x7fffffff;
      uVar24 = uVar6 & 0xffffffff;
      iVar19 = 0;
      iVar10 = 0;
      iVar8 = 0;
      do {
        iVar17 = (int)uVar24;
        iVar20 = -iVar17;
        if (0 < iVar17) {
          iVar20 = iVar17;
        }
        if (iVar20 < iVar15) {
          iVar8 = iVar10;
          iVar15 = iVar20;
          iVar19 = iVar10;
        }
        iVar10 = iVar10 + 1;
        uVar24 = (ulong)(iVar17 - 0x22);
      } while (iVar10 != 8);
      (&g_pvrtc2_alpha_match33_0)[uVar6 * 2] = (char)iVar19;
      (&DAT_0035e9c1)[uVar6 * 2] = (char)iVar8;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x100);
    iVar8 = -0x11;
    lVar3 = 0;
    do {
      iVar20 = 0x7fffffff;
      iVar17 = 0;
      iVar10 = 0;
      iVar19 = 0;
      iVar15 = iVar8;
      do {
        iVar12 = -iVar15;
        if (0 < iVar15) {
          iVar12 = iVar15;
        }
        if (iVar12 < iVar20) {
          iVar20 = iVar12;
          iVar10 = iVar17;
          iVar19 = iVar17;
        }
        iVar17 = iVar17 + 1;
        iVar15 = iVar15 + -0x22;
      } while (iVar17 != 8);
      (&g_pvrtc2_alpha_match33_3)[lVar3 * 2] = (char)iVar19;
      (&DAT_0035ebc1)[lVar3 * 2] = (char)iVar10;
      lVar3 = lVar3 + 1;
      iVar8 = iVar8 + 1;
    } while (lVar3 != 0x100);
    lVar3 = 0;
    do {
      iVar8 = 0x7fffffff;
      uVar25 = 0;
      uVar6 = 0;
      uVar11 = 0;
      do {
        iVar15 = 0;
        uVar24 = 0;
        do {
          iVar10 = (int)lVar3 -
                   ((((uint)uVar24 & 0xfffffff8) + (int)(uVar24 >> 1) + iVar15) * 3 +
                    (uVar25 * 0x21 + (uVar25 & 6) * 4) * 5 >> 3);
          iVar19 = -iVar10;
          if (0 < iVar10) {
            iVar19 = iVar10;
          }
          uVar23 = uVar25;
          uVar2 = uVar24;
          if (iVar8 <= iVar19) {
            iVar19 = iVar8;
            uVar23 = uVar11;
            uVar2 = uVar6;
          }
          uVar6 = uVar2;
          uVar11 = uVar23;
          iVar8 = iVar19;
          uVar23 = (uint)uVar24 + 1;
          uVar24 = (ulong)uVar23;
          iVar15 = iVar15 + 0x10;
        } while (uVar23 != 0x10);
        uVar25 = uVar25 + 1;
      } while (uVar25 != 8);
      (&g_pvrtc2_trans_match34)[lVar3 * 2] = (char)uVar11;
      (&DAT_0035edc1)[lVar3 * 2] = (char)uVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    lVar3 = 0;
    do {
      iVar8 = 0x7fffffff;
      uVar25 = 0;
      uVar6 = 0;
      uVar11 = 0;
      do {
        iVar15 = 0;
        uVar24 = 0;
        do {
          iVar10 = (int)lVar3 -
                   ((((uint)uVar24 & 0xfffffff8) + (int)(uVar24 >> 1) + iVar15) * 3 +
                    ((uVar25 >> 1) + (uVar25 & 8 | uVar25 << 4)) * 5 >> 3);
          iVar19 = -iVar10;
          if (0 < iVar10) {
            iVar19 = iVar10;
          }
          uVar23 = uVar25;
          uVar2 = uVar24;
          if (iVar8 <= iVar19) {
            iVar19 = iVar8;
            uVar23 = uVar11;
            uVar2 = uVar6;
          }
          uVar6 = uVar2;
          uVar11 = uVar23;
          iVar8 = iVar19;
          uVar23 = (uint)uVar24 + 1;
          uVar24 = (ulong)uVar23;
          iVar15 = iVar15 + 0x10;
        } while (uVar23 != 0x10);
        uVar25 = uVar25 + 1;
      } while (uVar25 != 0x10);
      (&g_pvrtc2_trans_match44)[lVar3 * 2] = (char)uVar11;
      (&DAT_0035efc1)[lVar3 * 2] = (char)uVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    g_transcoder_initialized = '\x01';
  }
  return;
}

Assistant:

void basisu_transcoder_init()
	{
		if (g_transcoder_initialized)
      {
         BASISU_DEVEL_ERROR("basisu_transcoder::basisu_transcoder_init: Called more than once\n");      
			return;
      }
         
     BASISU_DEVEL_ERROR("basisu_transcoder::basisu_transcoder_init: Initializing (this is not an error)\n");      

#if BASISD_SUPPORT_UASTC
		uastc_init();
#endif

#if BASISD_SUPPORT_ASTC
		transcoder_init_astc();
#endif
				
#if BASISD_WRITE_NEW_ASTC_TABLES
		create_etc1_to_astc_conversion_table_0_47();
		create_etc1_to_astc_conversion_table_0_255();
		exit(0);
#endif

#if BASISD_WRITE_NEW_BC7_MODE5_TABLES
		create_etc1_to_bc7_m5_color_conversion_table();
		create_etc1_to_bc7_m5_alpha_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_DXT1_TABLES
		create_etc1_to_dxt1_5_conversion_table();
		create_etc1_to_dxt1_6_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ETC2_EAC_A8_TABLES
		create_etc2_eac_a8_conversion_table();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ATC_TABLES
		create_etc1s_to_atc_conversion_tables();
		exit(0);
#endif

#if BASISD_WRITE_NEW_ETC2_EAC_R11_TABLES
		create_etc2_eac_r11_conversion_table();
		exit(0);
#endif

#if BASISD_SUPPORT_DXT1 || BASISD_SUPPORT_UASTC
		uint8_t bc1_expand5[32];
		for (int i = 0; i < 32; i++)
			bc1_expand5[i] = static_cast<uint8_t>((i << 3) | (i >> 2));
		prepare_bc1_single_color_table(g_bc1_match5_equals_1, bc1_expand5, 32, 32, 1);
		prepare_bc1_single_color_table(g_bc1_match5_equals_0, bc1_expand5, 1, 32, 0);

		uint8_t bc1_expand6[64];
		for (int i = 0; i < 64; i++)
			bc1_expand6[i] = static_cast<uint8_t>((i << 2) | (i >> 4));
		prepare_bc1_single_color_table(g_bc1_match6_equals_1, bc1_expand6, 64, 64, 1);
		prepare_bc1_single_color_table(g_bc1_match6_equals_0, bc1_expand6, 1, 64, 0);

#if 0
		for (uint32_t i = 0; i < 256; i++)
		{
			printf("%u %u %u\n", i, (i * 63 + 127) / 255, g_bc1_match6_equals_0[i].m_hi);
		}
		exit(0);
#endif

#endif

#if BASISD_SUPPORT_DXT1
		for (uint32_t i = 0; i < NUM_ETC1_TO_DXT1_SELECTOR_RANGES; i++)
		{
			uint32_t l = g_etc1_to_dxt1_selector_ranges[i].m_low;
			uint32_t h = g_etc1_to_dxt1_selector_ranges[i].m_high;
			g_etc1_to_dxt1_selector_range_index[l][h] = i;
		}

		for (uint32_t sm = 0; sm < NUM_ETC1_TO_DXT1_SELECTOR_MAPPINGS; sm++)
		{
			uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1[4];
			uint8_t etc1_to_dxt1_selector_mappings_raw_dxt1_inv[4];

			for (uint32_t j = 0; j < 4; j++)
			{
				static const uint8_t s_linear_dxt1_to_dxt1[4] = { 0, 2, 3, 1 };
				static const uint8_t s_dxt1_inverted_xlat[4] = { 1, 0, 3, 2 };

				etc1_to_dxt1_selector_mappings_raw_dxt1[j] = (uint8_t)s_linear_dxt1_to_dxt1[g_etc1_to_dxt1_selector_mappings[sm][j]];
				etc1_to_dxt1_selector_mappings_raw_dxt1_inv[j] = (uint8_t)s_dxt1_inverted_xlat[etc1_to_dxt1_selector_mappings_raw_dxt1[j]];
			}

			for (uint32_t i = 0; i < 256; i++)
			{
				uint32_t k = 0, k_inv = 0;
				for (uint32_t s = 0; s < 4; s++)
				{
					k |= (etc1_to_dxt1_selector_mappings_raw_dxt1[(i >> (s * 2)) & 3] << (s * 2));
					k_inv |= (etc1_to_dxt1_selector_mappings_raw_dxt1_inv[(i >> (s * 2)) & 3] << (s * 2));
				}
				g_etc1_to_dxt1_selector_mappings_raw_dxt1_256[sm][i] = (uint8_t)k;
				g_etc1_to_dxt1_selector_mappings_raw_dxt1_inv_256[sm][i] = (uint8_t)k_inv;
			}
		}
#endif

#if BASISD_SUPPORT_BC7_MODE5
		transcoder_init_bc7_mode5();
#endif

#if BASISD_SUPPORT_ATC
		transcoder_init_atc();
#endif

#if BASISD_SUPPORT_PVRTC2
		transcoder_init_pvrtc2();
#endif

		g_transcoder_initialized = true;
	}